

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

MP<8UL,_GF2::MOGrevlex<8UL>_> * __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,size_t i,MP<8UL,_GF2::MOGrevlex<8UL>_> *poly)

{
  _List_node_base *p_Var1;
  WW<8UL> local_30;
  
  local_30._words[0] = (word  [1])0;
  std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::clear
            (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
  p_Var1 = (_List_node_base *)poly;
  while (p_Var1 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var1->_M_next)->
                  super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
                  super__List_node_base._M_next, p_Var1 != (_List_node_base *)poly) {
    local_30._words[0] = (word  [1])(*(ulong *)(p_Var1 + 1) | 1L << ((byte)i & 0x3f));
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::push_back
              (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,
               (value_type *)&local_30);
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(size_t i, const MP& poly)
	{
		// предусловия
		assert(this != &poly && IsConsistent(poly));
		// сбор мономов
		MM<_n> m;
		SetEmpty();
		for (const_iterator iter = poly.begin(); iter != poly.end(); ++iter)
			(m = *iter).Set(i, 1), push_back(m);
		// нормализация
		Normalize();
		return *this;
	}